

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::CopyImage::FunctionalTest::compareImages
          (FunctionalTest *this,targetDesc *left_desc,GLubyte *left_data,GLuint left_x,GLuint left_y
          ,GLuint left_layer,GLuint left_level,targetDesc *right_desc,GLubyte *right_data,
          GLuint right_x,GLuint right_y,GLuint right_layer,GLuint right_level,GLuint region_width,
          GLuint region_height)

{
  bool bVar1;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar2;
  GLubyte *pixel;
  string local_300;
  long local_2e0;
  uint local_2d8;
  uint local_2d4;
  string local_2d0;
  long local_2b0;
  uint local_2a4;
  uint local_2a0 [4];
  MessageBuilder local_290;
  GLubyte *local_110;
  GLubyte *right_pixel_data;
  GLubyte *left_pixel_data;
  uint local_f8;
  GLuint right_pixel_offset;
  GLuint left_pixel_offset;
  GLuint x;
  GLubyte *right_line_data;
  GLubyte *left_line_data;
  uint local_d8;
  GLuint right_line_offset;
  GLuint left_line_offset;
  GLuint y;
  GLubyte *right_layer_data;
  GLubyte *left_layer_data;
  int local_b8;
  GLuint right_reg_pix_offset;
  GLuint right_reg_line_offset;
  GLuint right_layer_offset;
  GLuint left_reg_pix_offset;
  GLuint left_reg_line_offset;
  GLuint left_layer_offset;
  GLuint right_layer_size;
  GLuint right_line_size;
  GLuint right_pixel_size;
  GLuint left_layer_size;
  GLuint left_line_size;
  GLuint left_pixel_size;
  GLuint right_width;
  GLuint right_height;
  GLuint left_width;
  GLuint left_height;
  GLuint right_depths [3];
  GLuint right_widths [3];
  GLuint right_heights [3];
  GLuint left_depths [3];
  GLuint left_widths [3];
  GLuint left_heights [3];
  GLuint left_layer_local;
  GLuint left_y_local;
  GLuint left_x_local;
  GLubyte *left_data_local;
  targetDesc *left_desc_local;
  FunctionalTest *this_local;
  
  left_heights[1] = left_layer;
  left_heights[2] = left_y;
  calculateDimmensions
            (this,left_desc->m_target,left_desc->m_level,left_desc->m_width,left_desc->m_height,
             left_depths + 1,left_widths + 1,right_heights + 1);
  calculateDimmensions
            (this,right_desc->m_target,right_desc->m_level,right_desc->m_width,right_desc->m_height,
             right_depths + 1,right_widths + 1,&left_width);
  right_height = left_widths[(ulong)left_level + 1];
  right_width = left_depths[(ulong)left_level + 1];
  left_pixel_size = right_widths[(ulong)right_level + 1];
  left_line_size = right_depths[(ulong)right_level + 1];
  left_layer_size = Utils::getPixelSizeForFormat(left_desc->m_internal_format);
  right_pixel_size = left_layer_size * right_width;
  right_line_size = right_pixel_size * right_height;
  right_layer_size = Utils::getPixelSizeForFormat(right_desc->m_internal_format);
  left_layer_offset = right_layer_size * left_line_size;
  left_reg_line_offset = left_layer_offset * left_pixel_size;
  left_reg_pix_offset = right_line_size * left_heights[1];
  right_layer_offset = right_pixel_size * left_heights[2];
  right_reg_line_offset = left_layer_size * left_x;
  right_reg_pix_offset = left_reg_line_offset * right_layer;
  local_b8 = left_layer_offset * right_y;
  left_layer_data._4_4_ = right_layer_size * right_x;
  right_layer_data = left_data + left_reg_pix_offset;
  _left_line_offset = right_data + right_reg_pix_offset;
  right_line_offset = 0;
  do {
    if (region_height <= right_line_offset) {
      return true;
    }
    local_d8 = right_layer_offset + right_line_offset * right_pixel_size;
    left_line_data._4_4_ = local_b8 + right_line_offset * left_layer_offset;
    right_line_data = right_layer_data + local_d8;
    _left_pixel_offset = _left_line_offset + left_line_data._4_4_;
    for (right_pixel_offset = 0; right_pixel_offset < region_width;
        right_pixel_offset = right_pixel_offset + 1) {
      local_f8 = right_reg_line_offset + right_pixel_offset * left_layer_size;
      left_pixel_data._4_4_ = left_layer_data._4_4_ + right_pixel_offset * right_layer_size;
      right_pixel_data = right_line_data + local_f8;
      local_110 = _left_pixel_offset + left_pixel_data._4_4_;
      bVar1 = Utils::comparePixels
                        (left_layer_size,right_pixel_data,right_layer_size,local_110,
                         left_desc->m_internal_format);
      if ((!bVar1) &&
         (bVar1 = Utils::unpackAndComaprePixels
                            (left_desc->m_format,left_desc->m_type,left_desc->m_internal_format,
                             right_pixel_data,right_desc->m_format,right_desc->m_type,
                             right_desc->m_internal_format,local_110), !bVar1)) {
        this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        this_01 = tcu::TestContext::getLog(this_00);
        tcu::TestLog::operator<<(&local_290,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar2 = tcu::MessageBuilder::operator<<
                           (&local_290,(char (*) [35])"Not matching pixels found. Left: [");
        local_2a0[0] = right_pixel_offset + left_x;
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,local_2a0);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2a3caab);
        local_2a4 = right_line_offset + left_heights[2];
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_2a4);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2a3caab);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,left_heights + 1);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [7])"] lvl:");
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&left_level);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [8])0x29afcf3);
        local_2b0 = (long)right_pixel_data - (long)left_data;
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_2b0);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [9])", data: ");
        Utils::getPixelString_abi_cxx11_
                  (&local_2d0,(Utils *)(ulong)left_desc->m_internal_format,(GLenum)right_pixel_data,
                   left_data);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_2d0);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [11])". Right: [");
        local_2d4 = right_pixel_offset + right_x;
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_2d4);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2a3caab);
        local_2d8 = right_line_offset + right_y;
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_2d8);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2a3caab);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&right_layer);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [8])"] lvl: ");
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&right_level);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [8])0x29afcf3);
        local_2e0 = (long)local_110 - (long)right_data;
        pixel = right_data;
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_2e0);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [9])", data: ");
        Utils::getPixelString_abi_cxx11_
                  (&local_300,(Utils *)(ulong)right_desc->m_internal_format,(GLenum)local_110,pixel)
        ;
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_300);
        tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&local_300);
        std::__cxx11::string::~string((string *)&local_2d0);
        tcu::MessageBuilder::~MessageBuilder(&local_290);
        return false;
      }
    }
    right_line_offset = right_line_offset + 1;
  } while( true );
}

Assistant:

bool FunctionalTest::compareImages(const targetDesc& left_desc, const GLubyte* left_data, GLuint left_x, GLuint left_y,
								   GLuint left_layer, GLuint left_level, const targetDesc& right_desc,
								   const glw::GLubyte* right_data, GLuint right_x, GLuint right_y, GLuint right_layer,
								   GLuint right_level, GLuint region_width, GLuint region_height) const
{
	/* Get level dimmensions */
	GLuint left_heights[FUNCTIONAL_TEST_N_LEVELS];
	GLuint left_widths[FUNCTIONAL_TEST_N_LEVELS];
	GLuint left_depths[FUNCTIONAL_TEST_N_LEVELS];
	GLuint right_heights[FUNCTIONAL_TEST_N_LEVELS];
	GLuint right_widths[FUNCTIONAL_TEST_N_LEVELS];
	GLuint right_depths[FUNCTIONAL_TEST_N_LEVELS];

	calculateDimmensions(left_desc.m_target, left_desc.m_level, left_desc.m_width, left_desc.m_height, left_widths,
						 left_heights, left_depths);

	calculateDimmensions(right_desc.m_target, right_desc.m_level, right_desc.m_width, right_desc.m_height, right_widths,
						 right_heights, right_depths);

	/* Constants */
	/* Dimmensions */
	const GLuint left_height  = left_heights[left_level];
	const GLuint left_width   = left_widths[left_level];
	const GLuint right_height = right_heights[right_level];
	const GLuint right_width  = right_widths[right_level];
	/* Sizes */
	const GLuint left_pixel_size  = Utils::getPixelSizeForFormat(left_desc.m_internal_format);
	const GLuint left_line_size   = left_pixel_size * left_width;
	const GLuint left_layer_size  = left_line_size * left_height;
	const GLuint right_pixel_size = Utils::getPixelSizeForFormat(right_desc.m_internal_format);
	const GLuint right_line_size  = right_pixel_size * right_width;
	const GLuint right_layer_size = right_line_size * right_height;

	/* Offsets */
	const GLuint left_layer_offset	 = left_layer_size * left_layer;
	const GLuint left_reg_line_offset  = left_line_size * left_y;
	const GLuint left_reg_pix_offset   = left_pixel_size * left_x;
	const GLuint right_layer_offset	= right_layer_size * right_layer;
	const GLuint right_reg_line_offset = right_line_size * right_y;
	const GLuint right_reg_pix_offset  = right_pixel_size * right_x;

	/* Pointers */
	const GLubyte* left_layer_data  = left_data + left_layer_offset;
	const GLubyte* right_layer_data = right_data + right_layer_offset;

	/* For each line of region */
	for (GLuint y = 0; y < region_height; ++y)
	{
		/* Offsets */
		const GLuint left_line_offset  = left_reg_line_offset + y * left_line_size;
		const GLuint right_line_offset = right_reg_line_offset + y * right_line_size;

		/* Pointers */
		const GLubyte* left_line_data  = left_layer_data + left_line_offset;
		const GLubyte* right_line_data = right_layer_data + right_line_offset;

		/* For each pixel of region */
		for (GLuint x = 0; x < region_width; ++x)
		{
			/* Offsets */
			const GLuint left_pixel_offset  = left_reg_pix_offset + x * left_pixel_size;
			const GLuint right_pixel_offset = right_reg_pix_offset + x * right_pixel_size;

			/* Pointers */
			const GLubyte* left_pixel_data  = left_line_data + left_pixel_offset;
			const GLubyte* right_pixel_data = right_line_data + right_pixel_offset;

			/* Compare */
			if (false == Utils::comparePixels(left_pixel_size, left_pixel_data, right_pixel_size, right_pixel_data,
											  left_desc.m_internal_format))
			{
				if (false == Utils::unpackAndComaprePixels(left_desc.m_format, left_desc.m_type,
														   left_desc.m_internal_format, left_pixel_data,
														   right_desc.m_format, right_desc.m_type,
														   right_desc.m_internal_format, right_pixel_data))
				{
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "Not matching pixels found. Left: [" << x + left_x << ", "
						<< y + left_y << ", " << left_layer << "] lvl:" << left_level
						<< ", off: " << left_pixel_data - left_data
						<< ", data: " << Utils::getPixelString(left_desc.m_internal_format, left_pixel_data)
						<< ". Right: [" << x + right_x << ", " << y + right_y << ", " << right_layer
						<< "] lvl: " << right_level << ", off: " << right_pixel_data - right_data
						<< ", data: " << Utils::getPixelString(right_desc.m_internal_format, right_pixel_data)
						<< tcu::TestLog::EndMessage;

					return false;
				}
			}
		}
	}

	return true;
}